

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode ExtensionObject_encodeBinary(UA_ExtensionObject *src,UA_DataType *_)

{
  UA_ExtensionObjectEncoding UVar1;
  UA_DataType *pUVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auStack_48 [8];
  UA_NodeId typeId;
  
  UVar1 = src->encoding;
  if ((UVar1 & 0xff) < UA_EXTENSIONOBJECT_DECODED) {
    UVar3 = NodeId_encodeBinaryWithEncodingMask(&(src->content).encoded.typeId,'\0');
    uVar8 = 0x80080000;
    if (pos + 1 <= end) {
      *pos = (UA_Byte)UVar1;
      pos = pos + 1;
      uVar8 = 0;
    }
    uVar8 = uVar8 | UVar3;
    if (src->encoding - UA_EXTENSIONOBJECT_ENCODED_BYTESTRING < 2) {
      UVar3 = Array_encodeBinary((src->content).encoded.body.data,(src->content).encoded.body.length
                                 ,UA_TYPES + 2);
      uVar8 = uVar8 | UVar3;
    }
    else if (src->encoding != UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
      uVar8 = 0x80020000;
    }
  }
  else {
    pUVar2 = (src->content).decoded.type;
    uVar8 = 0x80060000;
    if ((pUVar2 != (UA_DataType *)0x0) && ((src->content).decoded.data != (void *)0x0)) {
      auStack_48._0_2_ = (pUVar2->typeId).namespaceIndex;
      auStack_48._2_2_ = *(undefined2 *)&(pUVar2->typeId).field_0x2;
      auStack_48._4_4_ = (pUVar2->typeId).identifierType;
      typeId.identifier.string.length = (size_t)(pUVar2->typeId).identifier.string.data;
      if (auStack_48._4_4_ == UA_NODEIDTYPE_NUMERIC) {
        typeId._2_2_ = 0;
        typeId.namespaceIndex = pUVar2->binaryEncodingId;
        typeId.identifierType = (UA_NodeIdType)((pUVar2->typeId).identifier.string.length >> 0x20);
        UVar3 = NodeId_encodeBinaryWithEncodingMask((UA_NodeId *)auStack_48,'\0');
        uVar7 = 0x80080000;
        if (pos + 1 <= end) {
          *pos = '\x01';
          pos = pos + 1;
          uVar7 = 0;
        }
        pUVar2 = (src->content).decoded.type;
        sVar5 = UA_calcSizeBinary((src->content).decoded.data,pUVar2);
        if (sVar5 < 0x80000000) {
          uVar8 = 0x80080000;
          if (pos + 4 <= end) {
            *(int *)pos = (int)sVar5;
            pos = pos + 4;
            uVar8 = 0;
          }
          uVar6 = 0x19;
          if ((pUVar2->field_0x25 & 1) != 0) {
            uVar6 = (ulong)pUVar2->typeIndex;
          }
          UVar4 = (*encodeBinaryJumpTable[uVar6])((src->content).decoded.data,pUVar2);
          uVar8 = uVar7 | UVar3 | uVar8 | UVar4;
        }
      }
    }
  }
  return uVar8;
}

Assistant:

static UA_StatusCode
ExtensionObject_encodeBinary(UA_ExtensionObject const *src, const UA_DataType *_) {
    UA_Byte encoding = src->encoding;

    /* No content or already encoded content */
    if(encoding <= UA_EXTENSIONOBJECT_ENCODED_XML) {
        UA_StatusCode retval = NodeId_encodeBinary(&src->content.encoded.typeId, NULL);
        retval |= Byte_encodeBinary(&encoding, NULL);
        switch (src->encoding) {
        case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
            break;
        case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
        case UA_EXTENSIONOBJECT_ENCODED_XML:
            retval |= ByteString_encodeBinary(&src->content.encoded.body);
            break;
        default:
            retval = UA_STATUSCODE_BADINTERNALERROR;
        }
        return retval;
    }

    /* Cannot encode with no data or no type description */
    if(!src->content.decoded.type || !src->content.decoded.data)
        return UA_STATUSCODE_BADENCODINGERROR;

    /* Write the NodeId for the binary encoded type */
    UA_NodeId typeId = src->content.decoded.type->typeId;
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        return UA_STATUSCODE_BADENCODINGERROR;
    typeId.identifier.numeric = src->content.decoded.type->binaryEncodingId;
    UA_StatusCode retval = NodeId_encodeBinary(&typeId, NULL);

    /* Write the encoding byte */
    encoding = UA_EXTENSIONOBJECT_ENCODED_BYTESTRING;
    retval |= Byte_encodeBinary(&encoding, NULL);

    /* Write the length of the following content */
    const UA_DataType *type = src->content.decoded.type;
    size_t len = UA_calcSizeBinary(src->content.decoded.data, type);
    if(len > UA_INT32_MAX)
        return UA_STATUSCODE_BADENCODINGERROR;
    UA_Int32 signed_len = (UA_Int32)len;
    retval |= Int32_encodeBinary(&signed_len);

    /* Encode the content */
    size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
    retval |= encodeBinaryJumpTable[encode_index](src->content.decoded.data, type);
    return retval;
}